

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompilerIdNode::EvaluateWithLanguage
          (string *__return_storage_ptr__,CompilerIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4,string *lang)

{
  cmMakefile *this_00;
  pointer pbVar1;
  char *__s2;
  cmGeneratorExpressionContext *backtrace;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  string *psVar5;
  cmake *this_01;
  PolicyID id;
  pointer pbVar6;
  char *pcVar7;
  allocator<char> local_89;
  string *local_88;
  cmGeneratorExpressionContext *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  GeneratorExpressionContent *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = context->LG->Makefile;
  local_80 = context;
  std::operator+(&local_50,"CMAKE_",lang);
  std::operator+(&local_78,&local_50,"_COMPILER_ID");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  pbVar6 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 == (parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    if (psVar5->_M_string_length == 0) {
      pcVar7 = "0";
      if (pbVar6->_M_string_length == 0) {
        pcVar7 = "1";
      }
    }
    else {
      local_88 = __return_storage_ptr__;
      local_58 = content;
      if ((EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
           ::compilerIdValidator == '\0') &&
         (iVar3 = __cxa_guard_acquire(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                       ::compilerIdValidator), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&EvaluateWithLanguage::compilerIdValidator,"^[A-Za-z0-9_]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &EvaluateWithLanguage::compilerIdValidator,&__dso_handle);
        __cxa_guard_release(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                             ::compilerIdValidator);
      }
      pbVar1 = (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (parameters->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
          pbVar6 = pbVar6 + 1) {
        bVar2 = cmsys::RegularExpression::find(&EvaluateWithLanguage::compilerIdValidator,pbVar6);
        if (!bVar2) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_78,local_58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Expression syntax not recognized.",&local_89);
          reportError(local_80,&local_78,&local_50);
          psVar5 = local_88;
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_78);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          return psVar5;
        }
        pcVar7 = (pbVar6->_M_dataplus)._M_p;
        __s2 = (psVar5->_M_dataplus)._M_p;
        iVar3 = strcmp(pcVar7,__s2);
        if (iVar3 == 0) {
LAB_003e3181:
          pcVar7 = "1";
          __return_storage_ptr__ = local_88;
          goto LAB_003e3192;
        }
        iVar3 = cmsysString_strcasecmp(pcVar7,__s2);
        if (iVar3 == 0) {
          PVar4 = cmLocalGenerator::GetPolicyStatus(local_80->LG,CMP0044);
          backtrace = local_80;
          if (PVar4 != OLD) {
            if (PVar4 != WARN) goto LAB_003e309b;
            this_01 = cmLocalGenerator::GetCMakeInstance(local_80->LG);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x2c,id);
            cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_78,&backtrace->Backtrace);
            std::__cxx11::string::~string((string *)&local_78);
          }
          goto LAB_003e3181;
        }
LAB_003e309b:
      }
      pcVar7 = "0";
      __return_storage_ptr__ = local_88;
    }
LAB_003e3192:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar7,(allocator<char> *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateWithLanguage(const std::vector<std::string>& parameters,
                                   cmGeneratorExpressionContext* context,
                                   const GeneratorExpressionContent* content,
                                   cmGeneratorExpressionDAGChecker* /*unused*/,
                                   const std::string& lang) const
  {
    std::string const& compilerId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_" + lang +
                                                    "_COMPILER_ID");
    if (parameters.empty()) {
      return compilerId;
    }
    if (compilerId.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }
    static cmsys::RegularExpression compilerIdValidator("^[A-Za-z0-9_]*$");

    for (auto const& param : parameters) {

      if (!compilerIdValidator.find(param)) {
        reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
        return std::string();
      }

      if (strcmp(param.c_str(), compilerId.c_str()) == 0) {
        return "1";
      }

      if (cmsysString_strcasecmp(param.c_str(), compilerId.c_str()) == 0) {
        switch (context->LG->GetPolicyStatus(cmPolicies::CMP0044)) {
          case cmPolicies::WARN: {
            context->LG->GetCMakeInstance()->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmPolicies::GetPolicyWarning(cmPolicies::CMP0044),
              context->Backtrace);
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            return "1";
          case cmPolicies::NEW:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
            break;
        }
      }
    }
    return "0";
  }